

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProductEvaluators.h
# Opt level: O0

void Eigen::internal::
     Assignment<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_0>,_Eigen::internal::assign_op<double,_double>,_Eigen::internal::Dense2Dense,_void>
     ::run(Matrix<double,__1,__1,_0,__1,__1> *dst,SrcXprType *src,assign_op<double,_double> *param_3
          )

{
  Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *rhs;
  Index IVar1;
  Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *pTVar2;
  Index IVar3;
  Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *in_RDX;
  Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
  *in_RSI;
  Index dstCols;
  Index dstRows;
  
  rhs = (Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
        Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_0>
        ::rows((Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
                *)0x159a1d);
  IVar1 = Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_0>
          ::cols((Product<Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_Eigen::Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>,_0>
                  *)0x159a2c);
  pTVar2 = (Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)
           PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::rows
                     ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x159a3b);
  if (pTVar2 == rhs) {
    IVar3 = PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::cols
                      ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)0x159a4c);
    if (IVar3 == IVar1) goto LAB_00159a67;
  }
  PlainObjectBase<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::resize
            ((PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)in_RSI,(Index)in_RDX,
             (Index)rhs);
LAB_00159a67:
  Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_0>
  ::lhs(in_RSI);
  Product<Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_Eigen::Transpose<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>,_0>
  ::rhs(in_RSI);
  generic_product_impl<Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>,Eigen::Transpose<Eigen::Matrix<double,-1,-1,0,-1,-1>>,Eigen::DenseShape,Eigen::DenseShape,8>
  ::evalTo<Eigen::Matrix<double,_1,_1,0,_1,_1>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)in_RSI,in_RDX,rhs);
  return;
}

Assistant:

static EIGEN_STRONG_INLINE
  void run(DstXprType &dst, const SrcXprType &src, const internal::assign_op<Scalar,Scalar> &)
  {
    Index dstRows = src.rows();
    Index dstCols = src.cols();
    if((dst.rows()!=dstRows) || (dst.cols()!=dstCols))
      dst.resize(dstRows, dstCols);
    // FIXME shall we handle nested_eval here?
    generic_product_impl<Lhs, Rhs>::evalTo(dst, src.lhs(), src.rhs());
  }